

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

int on_url(http_parser *parser,char *at,size_t length)

{
  _Bool _Var1;
  int iVar2;
  cio_http_cb_return cVar3;
  cio_http_location *pcVar4;
  cio_http_location_handler *handler_00;
  uint uVar5;
  cio_http_cb_return cb_ret;
  cio_http_location_handler *handler;
  cio_http_location *location;
  undefined1 local_50 [4];
  int ret;
  http_parser_url url;
  cio_http_client *client;
  size_t length_local;
  char *at_local;
  http_parser *parser_local;
  
  url.field_data._20_8_ = &parser[-0x1b].content_length;
  uVar5 = *(uint *)&parser->field_0x14 >> 0x10 & 0xff;
  parser[-0x14].http_major = (short)uVar5;
  parser[-0x14].http_minor = (short)(uVar5 >> 0x10);
  parser[2].content_length = (uint64_t)on_headers_complete;
  parser[1].data = on_header_field_name;
  *(code **)(parser + 2) = on_header_field_value;
  *(code **)&parser[2].http_major = on_body;
  parser[2].data = on_message_complete;
  http_parser_url_init((http_parser_url *)local_50);
  iVar2 = http_parser_parse_url
                    (at,length,(uint)((*(uint *)&parser->field_0x14 >> 0x10 & 0xff) == 5),
                     (http_parser_url *)local_50);
  if (iVar2 == 0) {
    _Var1 = path_in_url((http_parser_url *)local_50);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      pcVar4 = find_location((cio_http_server *)parser->data,at + (int)(uint)url.field_data[1].off,
                             (ulong)url.field_data[1].len);
      if (pcVar4 == (cio_http_location *)0x0) {
        *(undefined8 *)(url.field_data._20_8_ + 0x390) = 0;
        *(undefined8 *)(url.field_data._20_8_ + 0x398) = 0;
        write_response((cio_http_client *)url.field_data._20_8_,CIO_HTTP_STATUS_NOT_FOUND,
                       (cio_write_buffer *)0x0,(cio_response_written_cb_t)0x0);
        parser_local._4_4_ = CIO_HTTP_CB_SUCCESS;
      }
      else {
        handler_00 = (*pcVar4->alloc_handler)(pcVar4->config);
        if (handler_00 == (cio_http_location_handler *)0x0) {
          handle_server_error((cio_http_client *)url.field_data._20_8_,
                              "Allocation of handler failed!");
          parser_local._4_4_ = CIO_HTTP_CB_SUCCESS;
        }
        else if (handler_00->free == (_func_void_cio_http_location_handler_ptr *)0x0) {
          handle_server_error((cio_http_client *)url.field_data._20_8_,
                              "Handler has no function to free!");
          parser_local._4_4_ = CIO_HTTP_CB_SUCCESS;
        }
        else {
          *(cio_http_location_handler **)(url.field_data._20_8_ + 0xf0) = handler_00;
          _Var1 = cio_http_location_handler_no_callbacks(handler_00);
          if (_Var1) {
            handle_server_error((cio_http_client *)url.field_data._20_8_,
                                "No callbacks for given set in handler!");
            parser_local._4_4_ = CIO_HTTP_CB_SUCCESS;
          }
          else {
            cVar3 = call_url_parts_callback
                              ((http_parser_url *)local_50,UF_SCHEMA,handler_00->on_schema,
                               (cio_http_client *)url.field_data._20_8_,at);
            if (cVar3 == CIO_HTTP_CB_ERROR) {
              parser_local._4_4_ = CIO_HTTP_CB_ERROR;
            }
            else {
              cVar3 = call_url_parts_callback
                                ((http_parser_url *)local_50,UF_HOST,handler_00->on_host,
                                 (cio_http_client *)url.field_data._20_8_,at);
              if (cVar3 == CIO_HTTP_CB_ERROR) {
                parser_local._4_4_ = CIO_HTTP_CB_ERROR;
              }
              else {
                cVar3 = call_url_parts_callback
                                  ((http_parser_url *)local_50,UF_PORT,handler_00->on_port,
                                   (cio_http_client *)url.field_data._20_8_,at);
                if (cVar3 == CIO_HTTP_CB_ERROR) {
                  parser_local._4_4_ = CIO_HTTP_CB_ERROR;
                }
                else {
                  cVar3 = call_url_parts_callback
                                    ((http_parser_url *)local_50,UF_PATH,handler_00->on_path,
                                     (cio_http_client *)url.field_data._20_8_,at);
                  if (cVar3 == CIO_HTTP_CB_ERROR) {
                    parser_local._4_4_ = CIO_HTTP_CB_ERROR;
                  }
                  else {
                    cVar3 = call_url_parts_callback
                                      ((http_parser_url *)local_50,UF_QUERY,handler_00->on_query,
                                       (cio_http_client *)url.field_data._20_8_,at);
                    if (cVar3 == CIO_HTTP_CB_ERROR) {
                      parser_local._4_4_ = CIO_HTTP_CB_ERROR;
                    }
                    else {
                      cVar3 = call_url_parts_callback
                                        ((http_parser_url *)local_50,UF_FRAGMENT,
                                         handler_00->on_fragment,
                                         (cio_http_client *)url.field_data._20_8_,at);
                      if (cVar3 == CIO_HTTP_CB_ERROR) {
                        parser_local._4_4_ = CIO_HTTP_CB_ERROR;
                      }
                      else if ((handler_00->on_url == (cio_http_data_cb_t)0x0) ||
                              ((*(byte *)(url.field_data._20_8_ + 800) & 1) != 0)) {
                        parser_local._4_4_ = CIO_HTTP_CB_SUCCESS;
                      }
                      else {
                        parser_local._4_4_ =
                             (*handler_00->on_url)
                                       ((cio_http_client *)url.field_data._20_8_,at,length);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      parser_local._4_4_ = CIO_HTTP_CB_ERROR;
    }
  }
  else {
    parser_local._4_4_ = CIO_HTTP_CB_ERROR;
  }
  return parser_local._4_4_;
}

Assistant:

static int on_url(http_parser *parser, const char *at, size_t length)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);

	client->http_method = (enum cio_http_method)client->parser.method;

	client->parser_settings.on_headers_complete = on_headers_complete;
	client->parser_settings.on_header_field = on_header_field_name;
	client->parser_settings.on_header_value = on_header_field_value;
	client->parser_settings.on_body = on_body;
	client->parser_settings.on_message_complete = on_message_complete;

	struct http_parser_url url;
	http_parser_url_init(&url);
	int ret = http_parser_parse_url(at, length, cio_unlikely(parser->method == (unsigned int)HTTP_CONNECT) ? 1 : 0, &url);
	if (cio_unlikely(ret != 0)) {
		return -1;
	}

	if (cio_unlikely(!path_in_url(&url))) {
		return -1;
	}

	const struct cio_http_location *location = find_location(parser->data, at + url.field_data[UF_PATH].off, url.field_data[UF_PATH].len);
	if (cio_unlikely(location == NULL)) {
		client->parser_settings.on_header_field = NULL;
		client->parser_settings.on_header_value = NULL;
		write_response(client, CIO_HTTP_STATUS_NOT_FOUND, NULL, NULL);
		return 0;
	}

	struct cio_http_location_handler *handler = location->alloc_handler(location->config);
	if (cio_unlikely(handler == NULL)) {
		handle_server_error(client, "Allocation of handler failed!");
		return 0;
	}

	if (cio_unlikely(handler->free == NULL)) {
		handle_server_error(client, "Handler has no function to free!");
		return 0;
	}

	client->current_handler = handler;

	if (cio_unlikely(cio_http_location_handler_no_callbacks(handler))) {
		handle_server_error(client, "No callbacks for given set in handler!");
		return 0;
	}

	enum cio_http_cb_return cb_ret = call_url_parts_callback(&url, UF_SCHEMA, handler->on_schema, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_HOST, handler->on_host, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_PORT, handler->on_port, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_PATH, handler->on_path, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_QUERY, handler->on_query, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_FRAGMENT, handler->on_fragment, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	if (handler->on_url && (!client->http_private.response_fired)) {
		return handler->on_url(client, at, length);
	}

	return 0;
}